

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_code(void)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  bson_t scope;
  bson_t code;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  
  local_110 = 0;
  uStack_108 = 0;
  local_120 = 0;
  uStack_118 = 0;
  local_130 = 0;
  uStack_128 = 0;
  local_140 = 0;
  uStack_138 = 0;
  local_150 = 0;
  uStack_148 = 0;
  local_160 = 0;
  uStack_158 = 0;
  local_170 = 0;
  uStack_168 = 0;
  local_180 = 0x500000003;
  uStack_178 = 5;
  local_190 = 0;
  uStack_188 = 0;
  local_1a0 = 0;
  uStack_198 = 0;
  local_1b0 = 0;
  uStack_1a8 = 0;
  local_1c0 = 0;
  uStack_1b8 = 0;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1e0 = 0;
  uStack_1d8 = 0;
  local_1f0 = 0;
  uStack_1e8 = 0;
  local_200 = 0x500000003;
  uStack_1f8 = 5;
  cVar1 = bson_append_code(&local_180,"c",0xffffffffffffffff,"function () {}");
  if (cVar1 == '\0') {
    pcVar3 = "bson_append_code (&code, \"c\", -1, \"function () {}\")";
    uVar4 = 0x1cc;
  }
  else {
    pcVar3 = (char *)bson_as_json(&local_180,0);
    if (pcVar3 != "{ \"c\" : { \"$code\" : \"function () {}\" } }") {
      iVar2 = strcmp(pcVar3,"{ \"c\" : { \"$code\" : \"function () {}\" } }");
      if (iVar2 != 0) {
        pcVar5 = "{ \"c\" : { \"$code\" : \"function () {}\" } }";
        goto LAB_0011e3c9;
      }
    }
    bson_free(pcVar3);
    bson_reinit(&local_180);
    cVar1 = bson_append_code_with_scope(&local_180,"c",1,"function () {}",&local_200);
    if (cVar1 == '\0') {
      pcVar3 = "BSON_APPEND_CODE_WITH_SCOPE (&code, \"c\", \"function () {}\", &scope)";
      uVar4 = 0x1d5;
      goto LAB_0011e357;
    }
    pcVar3 = (char *)bson_as_json(&local_180,0);
    if (pcVar3 != "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { } } }") {
      iVar2 = strcmp(pcVar3,"{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { } } }");
      if (iVar2 != 0) {
        pcVar5 = "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { } } }";
        goto LAB_0011e3c9;
      }
    }
    bson_free(pcVar3);
    bson_reinit(&local_180);
    bson_append_int32(&local_200,"x",1,1);
    cVar1 = bson_append_code_with_scope(&local_180,"c",1,"function () {}",&local_200);
    if (cVar1 == '\0') {
      pcVar3 = "BSON_APPEND_CODE_WITH_SCOPE (&code, \"c\", \"function () {}\", &scope)";
      uVar4 = 0x1df;
      goto LAB_0011e357;
    }
    pcVar3 = (char *)bson_as_json(&local_180,0);
    if (pcVar3 != "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { \"x\" : 1 } } }") {
      iVar2 = strcmp(pcVar3,
                     "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { \"x\" : 1 } } }");
      if (iVar2 != 0) {
        pcVar5 = "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { \"x\" : 1 } } }";
        goto LAB_0011e3c9;
      }
    }
    bson_free(pcVar3);
    bson_reinit(&local_180);
    cVar1 = bson_append_code(&local_180,"c",1,"return \"a\"");
    if (cVar1 != '\0') {
      pcVar3 = (char *)bson_as_json(&local_180,0);
      if (pcVar3 != "{ \"c\" : { \"$code\" : \"return \\\"a\\\"\" } }") {
        iVar2 = strcmp(pcVar3,"{ \"c\" : { \"$code\" : \"return \\\"a\\\"\" } }");
        if (iVar2 != 0) {
          pcVar5 = "{ \"c\" : { \"$code\" : \"return \\\"a\\\"\" } }";
LAB_0011e3c9:
          fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar3,pcVar5);
          abort();
        }
      }
      bson_free(pcVar3);
      bson_destroy(&local_180);
      bson_destroy(&local_200);
      return;
    }
    pcVar3 = "BSON_APPEND_CODE (&code, \"c\", \"return \\\"a\\\"\")";
    uVar4 = 0x1e9;
  }
LAB_0011e357:
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar4,"test_bson_as_json_code",pcVar3);
  abort();
}

Assistant:

static void
test_bson_as_json_code (void)
{
   bson_t code = BSON_INITIALIZER;
   bson_t scope = BSON_INITIALIZER;
   char *str;

   BSON_ASSERT (bson_append_code (&code, "c", -1, "function () {}"));
   str = bson_as_json (&code, NULL);
   ASSERT_CMPSTR (str, "{ \"c\" : { \"$code\" : \"function () {}\" } }");

   bson_free (str);
   bson_reinit (&code);

   /* empty scope */
   BSON_ASSERT (
      BSON_APPEND_CODE_WITH_SCOPE (&code, "c", "function () {}", &scope));
   str = bson_as_json (&code, NULL);
   ASSERT_CMPSTR (
      str, "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { } } }");

   bson_free (str);
   bson_reinit (&code);

   BSON_APPEND_INT32 (&scope, "x", 1);
   BSON_ASSERT (
      BSON_APPEND_CODE_WITH_SCOPE (&code, "c", "function () {}", &scope));
   str = bson_as_json (&code, NULL);
   ASSERT_CMPSTR (str,
                  "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" "
                  ": { \"x\" : 1 } } }");

   bson_free (str);
   bson_reinit (&code);

   /* test that embedded quotes are backslash-escaped */
   BSON_ASSERT (BSON_APPEND_CODE (&code, "c", "return \"a\""));
   str = bson_as_json (&code, NULL);

   /* hard to read, this is { "c" : { "$code" : "return \"a\"" } } */
   ASSERT_CMPSTR (str, "{ \"c\" : { \"$code\" : \"return \\\"a\\\"\" } }");

   bson_free (str);
   bson_destroy (&code);
   bson_destroy (&scope);
}